

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

void __thiscall diy::FileStorage::get(FileStorage *this,int i,void *x,Load *load)

{
  int __fd;
  FileRecord fr;
  FileBuffer fb;
  undefined1 auStack_68 [8];
  _Alloc_hider local_60;
  BinaryBuffer local_40;
  FILE *local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  extract_file_record((FileRecord *)auStack_68,this,i);
  __fd = open(local_60._M_p,0,0x180);
  local_38 = fdopen(__fd,"r");
  local_40._vptr_BinaryBuffer = (_func_int **)&PTR__BinaryBuffer_0014e208;
  local_30 = 0;
  uStack_28 = 0;
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::operator()(load,x,&local_40);
  fclose(local_38);
  remove_file(this,(FileRecord *)auStack_68);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

virtual void   get(int i, void* x, detail::Load load) override
      {
        FileRecord fr = extract_file_record(i);

        //int fh = open(fr.name.c_str(), O_RDONLY | O_SYNC, 0600);
#if defined(_WIN32)
        int fh = -1;
        _sopen_s(&fh, fr.name.c_str(), _O_RDONLY | _O_BINARY, _SH_DENYNO, _S_IREAD);
        detail::FileBuffer fb(_fdopen(fh, "rb"));
#else
        int fh = open(fr.name.c_str(), O_RDONLY, 0600);
        detail::FileBuffer fb(fdopen(fh, "r"));
#endif
        load(x, fb);
        fclose(fb.file);

        remove_file(fr);
      }